

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaDfs.c
# Opt level: O1

Vec_Int_t * Gia_ManCollectSeq(Gia_Man_t *p,int *pPos,int nPos)

{
  uint uVar1;
  int iVar2;
  Vec_Int_t *p_00;
  int *piVar3;
  Vec_Int_t *p_01;
  long lVar4;
  ulong uVar5;
  
  p_00 = (Vec_Int_t *)malloc(0x10);
  p_00->nCap = 100;
  p_00->nSize = 0;
  piVar3 = (int *)malloc(400);
  p_00->pArray = piVar3;
  if (0 < nPos) {
    uVar5 = 0;
    do {
      uVar1 = pPos[uVar5];
      iVar2 = p->vCos->nSize;
      if (iVar2 - p->nRegs <= (int)uVar1) {
        __assert_fail("v < Gia_ManPoNum(p)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                      ,0x1d5,"Gia_Obj_t *Gia_ManPo(Gia_Man_t *, int)");
      }
      if (((int)uVar1 < 0) || (iVar2 <= (int)uVar1)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      iVar2 = p->vCos->pArray[uVar1];
      if ((iVar2 < 0) || (p->nObjs <= iVar2)) {
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                      ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      Vec_IntPush(p_00,iVar2);
      uVar5 = uVar5 + 1;
    } while ((uint)nPos != uVar5);
  }
  Gia_ManIncrementTravId(p);
  if (0 < p->nTravIdsAlloc) {
    *p->pTravIds = p->nTravIds;
    p_01 = (Vec_Int_t *)malloc(0x10);
    p_01->nCap = 1000;
    p_01->nSize = 0;
    piVar3 = (int *)malloc(4000);
    p_01->pArray = piVar3;
    Vec_IntPush(p_01,0);
    if (0 < p_00->nSize) {
      lVar4 = 0;
      do {
        Gia_ManCollectSeq_rec(p,p_00->pArray[lVar4],p_00,p_01);
        lVar4 = lVar4 + 1;
      } while (lVar4 < p_00->nSize);
    }
    if (p_00->pArray != (int *)0x0) {
      free(p_00->pArray);
      p_00->pArray = (int *)0x0;
    }
    free(p_00);
    return p_01;
  }
  __assert_fail("Id < p->nTravIdsAlloc",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                ,0x265,"void Gia_ObjSetTravIdCurrentId(Gia_Man_t *, int)");
}

Assistant:

Vec_Int_t * Gia_ManCollectSeq( Gia_Man_t * p, int * pPos, int nPos )
{
    Vec_Int_t * vObjs, * vRoots;
    int i, iRoot;
    // collect roots
    vRoots = Vec_IntAlloc( 100 );
    for ( i = 0; i < nPos; i++ )
        Vec_IntPush( vRoots, Gia_ObjId(p, Gia_ManPo(p, pPos[i])) );
    // start trav IDs
    Gia_ManIncrementTravId( p );
    Gia_ObjSetTravIdCurrentId( p, 0 );
    // collect objects
    vObjs = Vec_IntAlloc( 1000 );
    Vec_IntPush( vObjs, 0 );
    Vec_IntForEachEntry( vRoots, iRoot, i )
        Gia_ManCollectSeq_rec( p, iRoot, vRoots, vObjs );
    Vec_IntFree( vRoots );
    return vObjs;
}